

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

void __thiscall
vkt::api::anon_unknown_1::Framebuffer::Resources::Resources
          (Resources *this,Environment *env,Parameters *param_2)

{
  Parameters *pPVar1;
  Resources *extraout_RDX;
  Move<vk::Handle<(vk::HandleType)17>_> local_b8;
  Parameters local_98;
  
  local_98.image.flags = 0;
  local_98.image.imageType = VK_IMAGE_TYPE_2D;
  local_98.image.format = VK_FORMAT_R8G8B8A8_UNORM;
  local_98.image.extent.width = 0x100;
  local_98.image.extent.height = 0x100;
  local_98.image.extent.depth = 1;
  local_98.image.mipLevels = 1;
  local_98.image.arraySize = 1;
  local_98.image.samples = VK_SAMPLE_COUNT_1_BIT;
  local_98.image.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_98.image.usage = 0x10;
  local_98.image.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_98.viewType = VK_IMAGE_VIEW_TYPE_2D;
  local_98.format = VK_FORMAT_R8G8B8A8_UNORM;
  local_98.components.r = VK_COMPONENT_SWIZZLE_R;
  local_98.components.g = VK_COMPONENT_SWIZZLE_G;
  local_98.components.b = VK_COMPONENT_SWIZZLE_B;
  local_98.components.a = VK_COMPONENT_SWIZZLE_A;
  local_98.subresourceRange.aspectMask = 1;
  local_98.subresourceRange.baseMipLevel = 0;
  local_98.subresourceRange.levelCount = 1;
  local_98.subresourceRange.baseArrayLayer = 0;
  local_98.subresourceRange.layerCount = 1;
  Dependency<vkt::api::(anonymous_namespace)::ImageView>::Dependency
            (&this->colorAttachment,env,&local_98);
  local_98.image.flags = 0;
  local_98.image.imageType = VK_IMAGE_TYPE_2D;
  local_98.image.format = VK_FORMAT_D16_UNORM;
  pPVar1 = (Parameters *)0x10000000100;
  local_98.image.extent.width = 0x100;
  local_98.image.extent.height = 0x100;
  local_98.image.extent.depth = 1;
  local_98.image.mipLevels = 1;
  local_98.image.arraySize = 1;
  local_98.image.samples = VK_SAMPLE_COUNT_1_BIT;
  local_98.image.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_98.image.usage = 0x20;
  local_98.image.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_98.viewType = VK_IMAGE_VIEW_TYPE_2D;
  local_98.format = VK_FORMAT_D16_UNORM;
  local_98.components.r = VK_COMPONENT_SWIZZLE_R;
  local_98.components.g = VK_COMPONENT_SWIZZLE_G;
  local_98.components.b = VK_COMPONENT_SWIZZLE_B;
  local_98.components.a = VK_COMPONENT_SWIZZLE_A;
  local_98.subresourceRange.aspectMask = 2;
  local_98.subresourceRange.baseMipLevel = 0;
  local_98.subresourceRange.levelCount = 1;
  local_98.subresourceRange.baseArrayLayer = 0;
  local_98.subresourceRange.layerCount = 1;
  Dependency<vkt::api::(anonymous_namespace)::ImageView>::Dependency
            (&this->depthStencilAttachment,env,&local_98);
  RenderPass::create(&local_b8,env,extraout_RDX,pPVar1);
  (this->renderPass).object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  (this->renderPass).object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
  m_allocator = local_b8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  (this->renderPass).object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal
       = local_b8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  (this->renderPass).object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
  m_deviceIface =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  return;
}

Assistant:

Resources (const Environment& env, const Parameters&)
			: colorAttachment			(env, ImageView::Parameters(Image::Parameters(0u, VK_IMAGE_TYPE_2D, VK_FORMAT_R8G8B8A8_UNORM,
																					  makeExtent3D(256, 256, 1),
																					  1u, 1u,
																					  VK_SAMPLE_COUNT_1_BIT,
																					  VK_IMAGE_TILING_OPTIMAL,
																					  VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT,
																					  VK_IMAGE_LAYOUT_UNDEFINED),
																		 VK_IMAGE_VIEW_TYPE_2D, VK_FORMAT_R8G8B8A8_UNORM,
																		 makeComponentMappingRGBA(),
																		 makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u)))
			, depthStencilAttachment	(env, ImageView::Parameters(Image::Parameters(0u, VK_IMAGE_TYPE_2D, VK_FORMAT_D16_UNORM,
																					  makeExtent3D(256, 256, 1),
																					  1u, 1u,
																					  VK_SAMPLE_COUNT_1_BIT,
																					  VK_IMAGE_TILING_OPTIMAL,
																					  VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT,
																					  VK_IMAGE_LAYOUT_UNDEFINED),
																		 VK_IMAGE_VIEW_TYPE_2D, VK_FORMAT_D16_UNORM,
																		 makeComponentMappingRGBA(),
																		 makeImageSubresourceRange(VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 1u, 0u, 1u)))
			, renderPass				(env, RenderPass::Parameters())
		{}